

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestChild::~TestChild(TestChild *this)

{
  int iVar1;
  Exception *pEVar2;
  void *pvVar3;
  Fault local_70;
  Fault f_1;
  SyscallResult local_54 [2];
  SyscallResult _kjSyscallResult_1;
  int status;
  Fault f;
  SyscallResult local_34;
  Exception *pEStack_30;
  SyscallResult _kjSyscallResult;
  int *p;
  int *_p871;
  TestChild *this_local;
  
  pEVar2 = (Exception *)kj::_::readMaybe<int>(&this->pid);
  if (pEVar2 != (Exception *)0x0) {
    f.exception = pEVar2;
    pEStack_30 = pEVar2;
    local_34 = kj::_::Debug::
               syscall<kj::(anonymous_namespace)::TestChild::~TestChild()::_lambda()_1_>
                         ((anon_class_8_1_54a39810 *)&f,false);
    pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_34);
    if (pvVar3 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_34);
      kj::_::Debug::Fault::Fault
                ((Fault *)&status,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x368,iVar1,"::kill(p, SIGKILL)","");
      _kjSyscallResult_1.errorNumber = 1;
      kj::_::Debug::Fault::~Fault((Fault *)&status);
      goto LAB_002b759c;
    }
    f_1.exception = pEStack_30;
    local_54[0] = kj::_::Debug::
                  syscall<kj::(anonymous_namespace)::TestChild::~TestChild()::_lambda()_2_>
                            ((anon_class_16_2_eaca91f9 *)&f_1,false);
    pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_54);
    if (pvVar3 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(local_54);
      kj::_::Debug::Fault::Fault
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x36a,iVar1,"waitpid(p, &status, 0)","");
      _kjSyscallResult_1.errorNumber = 1;
      kj::_::Debug::Fault::~Fault(&local_70);
      goto LAB_002b759c;
    }
  }
  _kjSyscallResult_1.errorNumber = 0;
LAB_002b759c:
  Promise<int>::~Promise(&this->promise);
  Maybe<int>::~Maybe(&this->pid);
  return;
}

Assistant:

~TestChild() noexcept(false) {
    KJ_IF_SOME(p, pid) {
      KJ_SYSCALL(::kill(p, SIGKILL)) { return; }
      int status;
      KJ_SYSCALL(waitpid(p, &status, 0)) { return; }
    }
  }